

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O3

Status __thiscall HighsLpRelaxation::resolveLp(HighsLpRelaxation *this,HighsDomain *domain)

{
  double *pdVar1;
  HighsHashTableEntry<int,_std::pair<double,_int>_> *__args;
  uchar uVar2;
  int iVar3;
  CliqueVar CVar4;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var5;
  pointer piVar6;
  pointer pLVar7;
  long lVar8;
  pointer ppVar9;
  pointer piVar10;
  pointer pdVar11;
  pointer pSVar12;
  HighsLp *pHVar13;
  pointer pdVar14;
  pointer pdVar15;
  HighsInt j;
  Status SVar16;
  HighsInt HVar17;
  ValueType *pVVar18;
  ulong uVar19;
  int iVar20;
  u64 uVar21;
  uint uVar22;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> uVar23;
  uchar *puVar24;
  uchar *puVar25;
  uchar *puVar26;
  ulong uVar27;
  HighsMipSolver *pHVar28;
  uchar *puVar29;
  pair<int,_double> *fracint;
  pointer ppVar30;
  HighsMipSolver *pHVar31;
  long lVar32;
  long lVar33;
  bool bVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  HighsInt col;
  HighsHashTable<int,_std::pair<double,_int>_> fracints;
  double local_b0;
  vector<double,_std::allocator<double>_> local_98;
  HighsMipSolver *local_80;
  vector<double,_std::allocator<double>_> *local_78;
  vector<double,_std::allocator<double>_> *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *local_60;
  HighsHashTable<int,_std::pair<double,_int>_> local_58;
  
  ppVar30 = (this->fractionalints).
            super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->fractionalints).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVar30) {
    (this->fractionalints).
    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar30;
  }
  local_60 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
             &this->fractionalints;
  local_68 = &(this->lpsolver).solution_.col_value;
  local_70 = &(this->lpsolver).model_.lp_.col_upper_;
  local_78 = &(this->lpsolver).model_.lp_.col_lower_;
  do {
    if (domain != (HighsDomain *)0x0) {
      flushDomain(this,domain,false);
    }
    SVar16 = run(this,true);
    this->status = SVar16;
    if ((2 < SVar16 - kUnscaledDualFeasible) && (SVar16 != kOptimal)) {
      if (SVar16 == kInfeasible) {
        this->objective = INFINITY;
        return kInfeasible;
      }
      return SVar16;
    }
    HighsHashTable<int,_std::pair<double,_int>_>::HighsHashTable
              (&local_58,(long)this->maxNumFractional);
    _Var5._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    pHVar28 = *(HighsMipSolver **)
               &((_Var5._M_head_impl)->integral_cols).super__Vector_base<int,_std::allocator<int>_>;
    local_80 = *(HighsMipSolver **)((long)&(_Var5._M_head_impl)->integral_cols + 8);
    if (pHVar28 == local_80) {
      bVar34 = true;
    }
    else {
      bVar34 = true;
      do {
        iVar20 = *(int *)&pHVar28->callback_;
        lVar32 = (long)iVar20;
        pHVar31 = this->mipsolver;
        dVar37 = (this->lpsolver).model_.lp_.col_upper_.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar32];
        dVar38 = (this->lpsolver).solution_.col_value.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar32];
        if (dVar38 <= dVar37) {
          dVar37 = dVar38;
        }
        local_b0 = (this->lpsolver).model_.lp_.col_lower_.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar32];
        if (local_b0 <= dVar37) {
          local_b0 = dVar37;
        }
        dVar35 = round(local_b0);
        _Var5._M_head_impl =
             (pHVar31->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        dVar37 = (_Var5._M_head_impl)->feastol;
        if (ABS(local_b0 - dVar35) <= dVar37) {
          if ((this->lpsolver).basis_.col_status.
              super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
              super__Vector_impl_data._M_start[lVar32] != kBasic) {
            dVar35 = *(double *)
                      (*(long *)&((vector<double,_std::allocator<double>_> *)
                                 ((long)&(_Var5._M_head_impl)->domain + 800))->
                                 super__Vector_base<double,_std::allocator<double>_> + lVar32 * 8) -
                     dVar38;
            dVar38 = dVar38 - *(double *)
                               (*(long *)&((vector<double,_std::allocator<double>_> *)
                                          ((long)&(_Var5._M_head_impl)->domain + 0x308))->
                                          super__Vector_base<double,_std::allocator<double>_> +
                               lVar32 * 8);
            if (dVar35 <= dVar38) {
              dVar38 = dVar35;
            }
            if (dVar37 < dVar38) {
              piVar10 = (this->lpsolver).model_.lp_.a_matrix_.start_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              piVar6 = (pHVar31->model_->a_matrix_).start_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
              lVar33 = ((long)piVar6[lVar32 + 1] - (long)piVar6[lVar32]) + (long)piVar10[lVar32];
              iVar20 = piVar10[lVar32 + 1];
              if ((int)lVar33 < iVar20) {
                piVar10 = (this->lpsolver).model_.lp_.a_matrix_.index_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pLVar7 = (this->lprows).
                         super__Vector_base<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pdVar15 = (this->lpsolver).solution_.row_value.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar11 = (this->lpsolver).model_.lp_.row_upper_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  iVar3 = piVar10[lVar33];
                  if ((pLVar7[iVar3].age != 0) &&
                     (dVar38 = pdVar11[iVar3] - dVar37, pdVar1 = pdVar15 + iVar3,
                     dVar38 < *pdVar1 || dVar38 == *pdVar1)) {
                    pLVar7[iVar3].age = 0;
                  }
                  lVar33 = lVar33 + 1;
                } while (lVar33 < iVar20);
              }
            }
          }
        }
        else {
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(local_98.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,iVar20);
          if (bVar34) {
            if (*(int *)(*(long *)&((_Var5._M_head_impl)->uplocks).
                                   super__Vector_base<int,_std::allocator<int>_> + lVar32 * 4) == 0)
            {
              bVar34 = true;
            }
            else {
              bVar34 = *(int *)(*(long *)&((_Var5._M_head_impl)->downlocks).
                                          super__Vector_base<int,_std::allocator<int>_> + lVar32 * 4
                               ) == 0;
            }
          }
          else {
            bVar34 = false;
          }
          lVar33 = (long)*(int *)(*(long *)&((vector<int,_std::allocator<int>_> *)
                                            ((long)&(_Var5._M_head_impl)->cliquetable + 0x100))->
                                            super__Vector_base<int,_std::allocator<int>_> +
                                 lVar32 * 4);
          lVar32 = lVar33 * 8 +
                   *(long *)&((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                               *)((long)&(_Var5._M_head_impl)->cliquetable + 0x118))->
                             super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
          ;
          if (lVar32 != 8 && lVar33 != 0) {
            do {
              uVar22 = *(uint *)(lVar32 + -4);
              uVar19 = (ulong)(uVar22 & 0x7fffffff);
              pdVar15 = (local_78->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              dVar37 = pdVar15[uVar19];
              pdVar1 = (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + uVar19;
              if ((dVar37 == *pdVar1) && (!NAN(dVar37) && !NAN(*pdVar1))) {
                if (domain == (HighsDomain *)0x0) break;
                if (-1 < (int)uVar22) {
                  dVar37 = 1.0 - pdVar15[uVar22];
                }
                HighsDomain::fixCol(domain,iVar20,dVar37,(Reason)0xfffffffe);
                if (domain->infeasible_ != false) {
                  this->objective = INFINITY;
                  this->status = kInfeasible;
                  HighsHashTable<int,_std::pair<double,_int>_>::~HighsHashTable(&local_58);
                  return kInfeasible;
                }
                uVar22 = *(uint *)(lVar32 + -4);
                pHVar31 = this->mipsolver;
                uVar19 = (ulong)(uVar22 & 0x7fffffff);
              }
              iVar20 = (int)uVar19;
              local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_98.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,iVar20);
              if (-1 < (int)uVar22) {
                local_b0 = 1.0 - local_b0;
              }
              _Var5._M_head_impl =
                   (pHVar31->mipdata_)._M_t.
                   super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                   .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
              lVar33 = (long)*(int *)(*(long *)&((vector<int,_std::allocator<int>_> *)
                                                ((long)&(_Var5._M_head_impl)->cliquetable + 0x100))
                                                ->super__Vector_base<int,_std::allocator<int>_> +
                                     uVar19 * 4);
              if ((lVar33 == 0) ||
                 (lVar8 = *(long *)&((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                                      *)((long)&(_Var5._M_head_impl)->cliquetable + 0x118))->
                                    super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                 , lVar32 = lVar8 + lVar33 * 8, lVar8 + lVar33 * 8 == 8)) break;
            } while( true );
          }
          if (this->adjustSymBranchingCol == true) {
            HVar17 = HighsSymmetries::getBranchingColumn
                               (&((pHVar31->mipdata_)._M_t.
                                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)
                                 ->symmetries,local_78,local_70,iVar20);
            local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(local_98.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,HVar17);
          }
          pVVar18 = HighsHashTable<int,_std::pair<double,_int>_>::operator[]
                              (&local_58,(KeyType_conflict *)&local_98);
          pVVar18->first = local_b0 + pVVar18->first;
          pVVar18->second = pVVar18->second + 1;
        }
        pHVar28 = (HighsMipSolver *)((long)&pHVar28->callback_ + 4);
      } while (pHVar28 != local_80);
    }
    iVar20 = this->maxNumFractional;
    if (this->maxNumFractional <= (int)local_58.numElements) {
      iVar20 = (int)local_58.numElements;
    }
    this->maxNumFractional = iVar20;
    if ((domain == (HighsDomain *)0x0) ||
       ((domain->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (domain->changedcols_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish)) break;
    HighsHashTable<int,_std::pair<double,_int>_>::~HighsHashTable(&local_58);
  } while( true );
  puVar29 = (uchar *)((long)local_58.metadata._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                     local_58.tableSizeMask + 1);
  puVar26 = puVar29;
  if (local_58.numElements != 0) {
    uVar2 = *(uchar *)local_58.metadata._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    uVar23._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         local_58.metadata;
    for (uVar21 = local_58.tableSizeMask;
        (puVar26 = (uchar *)uVar23._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
        -1 < (char)uVar2 && (puVar26 = puVar29, uVar21 != 0)); uVar21 = uVar21 - 1) {
      uVar23._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
           ((long)uVar23._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1);
      uVar2 = *(uchar *)uVar23._M_t.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    }
  }
  if (puVar26 != puVar29) {
    do {
      __args = (HighsHashTableEntry<int,_std::pair<double,_int>_> *)
               ((long)local_58.entries._M_t.
                      super___uniq_ptr_impl<HighsHashTableEntry<int,_std::pair<double,_int>_>,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_HighsHashTable<int,_std::pair<double,_int>_>::OpNewDeleter>
                      .
                      super__Head_base<0UL,_HighsHashTableEntry<int,_std::pair<double,_int>_>_*,_false>
                      ._M_head_impl +
               (puVar26 + local_58.tableSizeMask + (1 - (long)puVar29)) * 0x18);
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((__args->value_).first / (double)(__args->value_).second);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int_const&,double>(local_60,(int *)__args,(double *)&local_98);
      do {
        puVar25 = puVar26;
        puVar24 = puVar25 + 1;
        puVar26 = puVar29;
        if (puVar24 == puVar29) break;
        puVar26 = puVar24;
      } while (-1 < (char)*puVar24);
    } while (puVar25 !=
             (uchar *)((long)local_58.metadata._M_t.
                             super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                             .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                      local_58.tableSizeMask));
  }
  if ((bVar34) &&
     ((this->fractionalints).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->fractionalints).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    std::vector<double,_std::allocator<double>_>::vector(&local_98,local_68);
    pdVar15 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVar30 = (this->fractionalints).
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppVar9 = (this->fractionalints).
             super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_80 = this->mipsolver;
    _Var5._M_head_impl =
         (local_80->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    if (ppVar30 != ppVar9) {
      piVar10 = ((_Var5._M_head_impl)->uplocks).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pdVar11 = (local_78->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      local_60 = (vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        lVar32 = (long)ppVar30->first;
        if ((piVar10[lVar32] != 0) ||
           ((pdVar1 = (local_80->model_->col_cost_).
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar32, 0.0 < *pdVar1 || *pdVar1 == 0.0 &&
            (((_Var5._M_head_impl)->downlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl
             .super__Vector_impl_data._M_start[lVar32] == 0)))) {
          dVar37 = (_Var5._M_head_impl)->feastol;
          dVar36 = floor(ppVar30->second + dVar37);
          dVar38 = pdVar11[lVar32];
          dVar35 = -INFINITY;
          if (-INFINITY < dVar38) {
            dVar35 = ceil(dVar38 - dVar37);
          }
          if (dVar35 <= dVar36) {
            dVar35 = dVar36;
          }
        }
        else {
          dVar37 = (_Var5._M_head_impl)->feastol;
          dVar38 = ceil(ppVar30->second - dVar37);
          dVar35 = INFINITY;
          if (*(double *)(local_60 + lVar32 * 8) < INFINITY) {
            dVar35 = floor(dVar37 + *(double *)(local_60 + lVar32 * 8));
          }
          if (dVar38 <= dVar35) {
            dVar35 = dVar38;
          }
        }
        pdVar15[lVar32] = dVar35;
        ppVar30 = ppVar30 + 1;
      } while (ppVar30 != ppVar9);
    }
    pSVar12 = (((vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
                 *)((long)&(_Var5._M_head_impl)->cliquetable + 0x118))->
              super__Vector_base<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>
              )._M_impl.super__Vector_impl_data._M_start;
    uVar22 = (int)((ulong)((long)*(pointer *)((long)&(_Var5._M_head_impl)->cliquetable + 0x120) -
                          (long)pSVar12) >> 3) - 1;
    if (-1 < (int)uVar22) {
      lVar32 = (ulong)uVar22 + 1;
      do {
        CVar4 = pSVar12[lVar32 + -1].replace;
        if ((long)(int)CVar4 < 0) {
          dVar37 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[(uint)CVar4 & 0x7fffffff];
        }
        else {
          dVar37 = 1.0 - local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[(int)CVar4];
        }
        local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[pSVar12[lVar32 + -1].substcol] = dVar37;
        lVar33 = lVar32 + -1;
        bVar34 = 0 < lVar32;
        lVar32 = lVar33;
      } while (lVar33 != 0 && bVar34);
    }
    uVar19 = (ulong)(uint)local_80->model_->num_col_;
    if (uVar19 == 0) {
      dVar37 = 0.0;
    }
    else {
      dVar35 = 0.0;
      uVar27 = 0;
      dVar38 = 0.0;
      do {
        dVar36 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar27] *
                 (local_80->model_->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar27];
        dVar37 = dVar38 + dVar36;
        dVar35 = dVar35 + (dVar38 - (dVar37 - dVar36)) + (dVar36 - (dVar37 - (dVar37 - dVar36)));
        uVar27 = uVar27 + 1;
        dVar38 = dVar37;
      } while (uVar19 != uVar27);
      dVar37 = dVar37 + dVar35;
    }
    HighsMipSolverData::addIncumbent(_Var5._M_head_impl,&local_98,dVar37,7,true,false);
    if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  pHVar13 = this->mipsolver->model_;
  uVar19 = (ulong)(uint)pHVar13->num_col_;
  if (uVar19 == 0) {
    dVar38 = 0.0;
    dVar37 = 0.0;
  }
  else {
    dVar37 = 0.0;
    uVar27 = 0;
    dVar35 = 0.0;
    do {
      dVar36 = (local_68->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar27] *
               (pHVar13->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar27];
      dVar38 = dVar35 + dVar36;
      dVar37 = dVar37 + (dVar35 - (dVar38 - dVar36)) + (dVar36 - (dVar38 - (dVar38 - dVar36)));
      uVar27 = uVar27 + 1;
      dVar35 = dVar38;
    } while (uVar19 != uVar27);
  }
  if ((((this->fractionalints).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        (this->fractionalints).
        super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl
        .super__Vector_impl_data._M_finish) && (this->status != kOptimal)) &&
     (this->status != kUnscaledPrimalFeasible)) {
    std::vector<double,_std::allocator<double>_>::vector(&local_98,local_68);
    pdVar15 = local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_80 = this->mipsolver;
    pHVar13 = local_80->model_;
    lVar32 = (long)pHVar13->num_col_;
    if (0 < lVar32) {
      pdVar11 = (local_78->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pdVar14 = (local_70->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar33 = 0;
      do {
        dVar35 = pdVar15[lVar33];
        dVar36 = pdVar11[lVar33];
        if ((dVar35 < dVar36) || (dVar36 = pdVar14[lVar33], dVar36 < dVar35)) {
LAB_002adbdb:
          pdVar15[lVar33] = dVar36;
        }
        else if ((pHVar13->integrality_).
                 super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar33] != kContinuous) {
          dVar36 = round(dVar35);
          goto LAB_002adbdb;
        }
        lVar33 = lVar33 + 1;
      } while (lVar32 != lVar33);
    }
    bVar34 = HighsMipSolverData::checkSolution
                       ((local_80->mipdata_)._M_t.
                        super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                        .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl,&local_98);
    if (bVar34) {
      pdVar15 = (this->lpsolver).solution_.col_value.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      (this->lpsolver).solution_.col_value.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start =
           local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      (this->lpsolver).solution_.col_value.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (this->lpsolver).solution_.col_value.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pdVar15 != (pointer)0x0) {
        operator_delete(pdVar15);
      }
      this->status = (uint)((this->status - kOptimal & 0xfffffffd) != 0) * 3 + kOptimal;
    }
    if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  this->objective = dVar38 + dVar37;
  HighsHashTable<int,_std::pair<double,_int>_>::~HighsHashTable(&local_58);
  return this->status;
}

Assistant:

HighsLpRelaxation::Status HighsLpRelaxation::resolveLp(HighsDomain* domain) {
  fractionalints.clear();

  bool solveagain;
  do {
    solveagain = false;
    if (domain) flushDomain(*domain);
    status = run();

    switch (status) {
      case Status::kUnscaledInfeasible:
      case Status::kUnscaledDualFeasible:
      case Status::kUnscaledPrimalFeasible:
      case Status::kOptimal: {
        HighsHashTable<HighsInt, std::pair<double, int>> fracints(
            maxNumFractional);
        const HighsSolution& sol = lpsolver.getSolution();

        HighsCDouble objsum = 0;
        bool roundable = true;

        for (HighsInt i : mipsolver.mipdata_->integral_cols) {
          // for the fractionality we assume that LP bounds are not violated
          // bounds that are violated by the unscaled LP are indicated by the
          // return status already
          double val = std::max(
              std::min(sol.col_value[i], lpsolver.getLp().col_upper_[i]),
              lpsolver.getLp().col_lower_[i]);

          if (fractionality(val) > mipsolver.mipdata_->feastol) {
            HighsInt col = i;
            roundable = roundable && (mipsolver.mipdata_->uplocks[col] == 0 ||
                                      mipsolver.mipdata_->downlocks[col] == 0);

            const HighsCliqueTable::Substitution* subst =
                mipsolver.mipdata_->cliquetable.getSubstitution(col);
            while (subst != nullptr) {
              if (lpsolver.getLp().col_lower_[subst->replace.col] ==
                  lpsolver.getLp().col_upper_[subst->replace.col]) {
                if (domain) {
                  domain->fixCol(
                      col, subst->replace.weight(lpsolver.getLp().col_lower_));
                  if (domain->infeasible()) {
                    objective = kHighsInf;
                    status = Status::kInfeasible;
                    return status;
                  }
                } else
                  break;
              }

              col = subst->replace.col;
              if (subst->replace.val == 0) val = 1.0 - val;

              subst = mipsolver.mipdata_->cliquetable.getSubstitution(col);
            }

            if (adjustSymBranchingCol)
              col = mipsolver.mipdata_->symmetries.getBranchingColumn(
                  getLp().col_lower_, getLp().col_upper_, col);

            auto& pair = fracints[col];
            pair.first += val;
            pair.second += 1;
          } else {
            if (lpsolver.getBasis().col_status[i] == HighsBasisStatus::kBasic)
              continue;

            const double glb = mipsolver.mipdata_->domain.col_lower_[i];
            const double gub = mipsolver.mipdata_->domain.col_upper_[i];

            if (std::min(gub - sol.col_value[i], sol.col_value[i] - glb) <=
                mipsolver.mipdata_->feastol)
              continue;

            const auto& matrix = lpsolver.getLp().a_matrix_;
            const HighsInt colStart =
                matrix.start_[i] + (mipsolver.model_->a_matrix_.start_[i + 1] -
                                    mipsolver.model_->a_matrix_.start_[i]);
            const HighsInt colEnd = matrix.start_[i + 1];

            // skip further checks if the column has no entry in any cut
            if (colStart == colEnd) continue;

            for (HighsInt j = colStart; j < colEnd; ++j) {
              HighsInt row = matrix.index_[j];
              assert(row >= mipsolver.numRow());

              // age is already zero, so irrelevant whether we reset it
              if (lprows[row].age == 0) continue;

              // check that row has no slack in the current solution
              if (sol.row_value[row] <
                  getLp().row_upper_[row] - mipsolver.mipdata_->feastol)
                continue;

              lprows[row].age = 0;
            }
          }
        }

        maxNumFractional =
            std::max((HighsInt)fracints.size(), maxNumFractional);

        if (domain && !domain->getChangedCols().empty()) {
          // printf("resolving due to fixings of substituted columns\n");
          solveagain = true;
          continue;
        }

        for (const auto& it : fracints) {
          fractionalints.emplace_back(
              it.key(), it.value().first / (double)it.value().second);
        }

        if (roundable && !fractionalints.empty()) {
          std::vector<double> roundsol = sol.col_value;

          for (const std::pair<HighsInt, double>& fracint : fractionalints) {
            // get column index
            HighsInt col = fracint.first;
            // round based on locks and sign of objective coefficient
            if (mipsolver.mipdata_->uplocks[col] == 0 &&
                (mipsolver.colCost(col) < 0 ||
                 mipsolver.mipdata_->downlocks[col] != 0)) {
              // round up
              roundsol[col] = std::min(
                  std::ceil(fracint.second - mipsolver.mipdata_->feastol),
                  lpsolver.getLp().col_upper_[col] == kHighsInf
                      ? kHighsInf
                      : std::floor(lpsolver.getLp().col_upper_[col] +
                                   mipsolver.mipdata_->feastol));
            } else {
              // round down
              roundsol[col] = std::max(
                  std::floor(fracint.second + mipsolver.mipdata_->feastol),
                  lpsolver.getLp().col_lower_[col] == -kHighsInf
                      ? -kHighsInf
                      : std::ceil(lpsolver.getLp().col_lower_[col] -
                                  mipsolver.mipdata_->feastol));
            }
          }

          const auto& cliquesubst =
              mipsolver.mipdata_->cliquetable.getSubstitutions();
          for (HighsInt k = cliquesubst.size() - 1; k >= 0; --k) {
            if (cliquesubst[k].replace.val == 0)
              roundsol[cliquesubst[k].substcol] =
                  1 - roundsol[cliquesubst[k].replace.col];
            else
              roundsol[cliquesubst[k].substcol] =
                  roundsol[cliquesubst[k].replace.col];
          }

          for (HighsInt i = 0; i != mipsolver.numCol(); ++i)
            objsum += roundsol[i] * mipsolver.colCost(i);

          mipsolver.mipdata_->addIncumbent(roundsol, double(objsum),
                                           kSolutionSourceSolveLp);
          objsum = 0;
        }

        for (HighsInt i = 0; i != mipsolver.numCol(); ++i)
          objsum += sol.col_value[i] * mipsolver.colCost(i);

        if (fractionalints.empty() && !unscaledPrimalFeasible(status)) {
          std::vector<double> fixSol = sol.col_value;
          for (HighsInt i = 0; i < mipsolver.numCol(); ++i) {
            if (fixSol[i] < lpsolver.getLp().col_lower_[i])
              fixSol[i] = lpsolver.getLp().col_lower_[i];
            else if (fixSol[i] > lpsolver.getLp().col_upper_[i])
              fixSol[i] = lpsolver.getLp().col_upper_[i];
            else if (mipsolver.variableType(i) != HighsVarType::kContinuous)
              fixSol[i] = std::round(fixSol[i]);
          }

          if (mipsolver.mipdata_->checkSolution(fixSol)) {
            const_cast<std::vector<double>&>(sol.col_value) = std::move(fixSol);
            if (unscaledDualFeasible(status))
              status = Status::kOptimal;
            else
              status = Status::kUnscaledPrimalFeasible;
          }
        }

        objective = double(objsum);
        break;
      }
      case Status::kInfeasible:
        objective = kHighsInf;
        break;
      default:
        break;
    }
  } while (solveagain);

  return status;
}